

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O1

void predict_or_learn<true>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  float fVar1;
  float fVar2;
  byte bVar3;
  uint uVar4;
  vw *pvVar5;
  vw *pvVar6;
  element_type *peVar7;
  size_type sVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar9;
  int iVar10;
  uint64_t *puVar11;
  int iVar12;
  undefined8 uVar13;
  byte *pbVar14;
  weight *pwVar15;
  ostream *poVar16;
  char *pcVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar18;
  byte bVar19;
  uint32_t *puVar20;
  uint uVar21;
  ulong uVar22;
  byte *pbVar23;
  ulong uVar24;
  v_array<unsigned_char> *__range1;
  example *peVar25;
  ulong i;
  bool bVar26;
  float fVar27;
  double dVar28;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  float local_2c0;
  float local_2bc;
  ulong local_298;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  element_type local_268;
  ulong local_228;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_220;
  single_learner *local_218;
  byte *local_210;
  byte *local_208;
  features *local_200;
  sparse_parameters *local_1f8;
  ulong local_1f0;
  uint64_t local_1e8;
  ulong local_1e0;
  unsigned_long local_1d8;
  ulong local_1d0;
  char *local_1c8;
  char *local_1c0;
  ulong local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pvVar5 = lrq->all;
  __s = lrq->orig_size;
  local_218 = base;
  memset(__s,0,0x800);
  pbVar23 = (ec->super_example_predict).indices._end;
  for (pbVar14 = (ec->super_example_predict).indices._begin; pbVar14 != pbVar23;
      pbVar14 = (byte *)((long)pbVar14 + 1)) {
    bVar3 = *pbVar14;
    __s[bVar3] = (long)(ec->super_example_predict).feature_space[bVar3].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar3].values._begin >> 2;
  }
  local_268.first.field_2._8_8_ = ec->example_counter;
  uVar4 = lrq->k;
  dVar28 = (double)uVar4;
  fVar1 = (ec->l).simple.label;
  if (dVar28 < 0.0) {
    dVar28 = sqrt(dVar28);
  }
  else {
    dVar28 = SQRT(dVar28);
  }
  pvVar6 = lrq->all;
  puVar20 = &(pvVar6->weights).dense_weights._stride_shift;
  puVar11 = &(pvVar6->weights).dense_weights._weight_mask;
  if ((pvVar6->weights).sparse != false) {
    puVar20 = &(pvVar6->weights).sparse_weights._stride_shift;
    puVar11 = &(pvVar6->weights).sparse_weights._weight_mask;
  }
  local_1e8 = *puVar11;
  local_268.second.field_2._M_allocated_capacity = (size_type)*puVar20;
  local_1f8 = &(pvVar5->weights).sparse_weights;
  local_2bc = 0.0;
  local_2c0 = 0.0;
  local_268.second._M_string_length = (size_type)ec;
  iVar12 = 0;
  while( true ) {
    peVar25 = (example *)local_268.second._M_string_length;
    if ((lrq->field_name)._M_string_length != 0) {
      local_268.first.field_2._M_allocated_capacity = (size_type)(lrq->field_name)._M_dataplus._M_p;
      do {
        pbVar14 = (byte *)(local_268.first.field_2._M_allocated_capacity + 1);
        uVar13 = pbVar14;
        local_210 = (byte *)local_268.first.field_2._M_allocated_capacity;
        if (pbVar14 !=
            (byte *)((lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length)) {
          do {
            local_268.first.field_2._M_allocated_capacity = uVar13;
            bVar26 = (local_268.first.field_2._8_8_ & 1) == 0;
            pbVar23 = local_210;
            if (bVar26) {
              pbVar23 = pbVar14;
            }
            local_268.second._M_dataplus._M_p = (pointer)(ulong)*pbVar23;
            pbVar23 = pbVar14;
            if (bVar26) {
              pbVar23 = local_210;
            }
            local_208 = pbVar14;
            if (__s[(long)local_268.second._M_dataplus._M_p] != 0) {
              bVar3 = *pbVar23;
              local_228 = (ulong)bVar3;
              local_200 = (ec->super_example_predict).feature_space +
                          (long)local_268.second._M_dataplus._M_p;
              local_1e0 = (ulong)(lrq->field_id[local_228] * uVar4);
              this = (ec->super_example_predict).feature_space + local_228;
              local_1f0 = (ulong)(lrq->field_id[(long)local_268.second._M_dataplus._M_p] * uVar4);
              local_220 = &(ec->super_example_predict).feature_space[local_228].space_names;
              local_298 = 0;
              do {
                if (uVar4 != 0) {
                  fVar2 = (local_200->values)._begin[local_298];
                  local_1d8 = (local_200->indicies)._begin[local_298];
                  uVar24 = 1;
                  do {
                    uVar22 = ((ulong)(uint)((int)uVar24 + (int)local_1e0) <<
                             ((byte)local_268.second.field_2._M_allocated_capacity & 0x3f)) +
                             local_1d8;
                    i = uVar22 & local_1e8;
                    local_268.second.field_2._8_8_ = uVar24;
                    if ((pvVar5->weights).sparse == true) {
                      pwVar15 = sparse_parameters::operator[](local_1f8,i);
                    }
                    else {
                      pwVar15 = (pvVar5->weights).dense_weights._begin +
                                (i & (pvVar5->weights).dense_weights._weight_mask);
                    }
                    fVar27 = (peVar25->l).simple.label;
                    if ((((fVar27 != 3.4028235e+38) || (NAN(fVar27))) && (*pwVar15 == 0.0)) &&
                       (!NAN(*pwVar15))) {
                      local_1b8[0] = uVar22;
                      fVar27 = merand48(local_1b8);
                      *pwVar15 = (fVar27 * 0.5) / (float)dVar28;
                    }
                    if (__s[local_228] != 0) {
                      iVar9 = (int)local_268.second.field_2._8_8_;
                      iVar10 = (int)local_1f0;
                      bVar19 = (byte)local_268.second.field_2._M_allocated_capacity;
                      local_1d0 = local_268.second.field_2._8_8_ & 0xffffffff;
                      uVar21 = 1;
                      uVar24 = 0;
                      do {
                        features::push_back(this,*pwVar15 * fVar2 * (this->values)._begin[uVar24],
                                            (this->indicies)._begin[uVar24] +
                                            ((ulong)(uint)(iVar9 + iVar10) << (bVar19 & 0x3f)));
                        if ((pvVar5->audit != false) || (pvVar5->hash_inv == true)) {
                          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                          local_278.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_ = bVar3;
                          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_1a8,(char *)&local_278,1);
                          local_278.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_ = 0x5e;
                          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar16,(char *)&local_278,1);
                          peVar7 = local_220->_begin[uVar24].
                                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar16,(peVar7->second)._M_dataplus._M_p,
                                               (peVar7->second)._M_string_length);
                          local_278.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)
                                    CONCAT71(local_278.
                                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr._1_7_,0x5e);
                          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar16,(char *)&local_278,1);
                          std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                          local_1c0 = strdup("lrqfa");
                          std::__cxx11::stringbuf::str();
                          peVar7 = local_278.
                                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          pcVar17 = strdup((char *)local_278.
                                                                                                      
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                          if (peVar7 != &local_268) {
                            operator_delete(peVar7);
                          }
                          local_1c8 = pcVar17;
                          this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)operator_new(0x40);
                          std::
                          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::pair<char_*&,_char_*&,_true>(this_01,&local_1c0,&local_1c8);
                          local_278.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = this_01;
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                          __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                    (&local_278.
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,this_01);
                          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::push_back(local_220,&local_278);
                          if (local_278.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_278.
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                        }
                        uVar24 = (ulong)uVar21;
                        uVar21 = uVar21 + 1;
                      } while (uVar24 < __s[local_228]);
                    }
                    uVar21 = (int)local_268.second.field_2._8_8_ + 1;
                    uVar24 = (ulong)uVar21;
                    peVar25 = (example *)local_268.second._M_string_length;
                  } while (uVar21 <= uVar4);
                }
                local_298 = (ulong)((int)local_298 + 1);
              } while (local_298 < __s[(long)local_268.second._M_dataplus._M_p]);
            }
            pbVar14 = local_208 + 1;
            uVar13 = local_268.first.field_2._M_allocated_capacity;
          } while (pbVar14 !=
                   (byte *)((lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length)
                  );
        }
        local_268.first.field_2._M_allocated_capacity = uVar13;
      } while ((pointer)local_268.first.field_2._M_allocated_capacity !=
               (lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length);
    }
    (**(code **)(local_218 + 0x28))
              (*(undefined8 *)(local_218 + 0x18),*(undefined8 *)(local_218 + 0x20),peVar25);
    if (iVar12 == 0) {
      local_2bc = (peVar25->pred).scalar;
      local_2c0 = peVar25->loss;
    }
    else {
      (peVar25->pred).scalar = local_2bc;
      peVar25->loss = local_2c0;
    }
    sVar8 = (lrq->field_name)._M_string_length;
    if (sVar8 != 0) {
      pbVar14 = (byte *)(lrq->field_name)._M_dataplus._M_p;
      pbVar23 = pbVar14 + sVar8;
      do {
        bVar3 = *pbVar14;
        (ec->super_example_predict).feature_space[bVar3].values._end =
             (ec->super_example_predict).feature_space[bVar3].values._begin + __s[bVar3];
        if ((pvVar5->audit != false) || (pvVar5->hash_inv == true)) {
          uVar24 = __s[bVar3];
          psVar18 = (ec->super_example_predict).feature_space[bVar3].space_names._begin;
          if (uVar24 < (ulong)((long)(ec->super_example_predict).feature_space[bVar3].space_names.
                                     _end - (long)psVar18 >> 4)) {
            uVar22 = uVar24 << 4 | 8;
            do {
              this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&(psVar18->
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + uVar22);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              uVar24 = uVar24 + 1;
              psVar18 = (ec->super_example_predict).feature_space[bVar3].space_names._begin;
              uVar22 = uVar22 + 0x10;
            } while (uVar24 < (ulong)((long)(ec->super_example_predict).feature_space[bVar3].
                                            space_names._end - (long)psVar18 >> 4));
          }
          (ec->super_example_predict).feature_space[bVar3].space_names._end = psVar18 + __s[bVar3];
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar23);
    }
    if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) break;
    local_268.first.field_2._8_8_ = local_268.first.field_2._8_8_ + 1;
    bVar26 = iVar12 != 0;
    iVar12 = iVar12 + 1;
    if (bVar26) {
      return;
    }
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}